

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_string_length(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *plVar1;
  ly_bool lVar2;
  LY_ERR LVar3;
  lysc_node *plVar4;
  char *pcVar5;
  size_t sVar6;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR rc;
  lysc_node_leaf *sleaf;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t arg_count_local;
  lyxp_set **args_local;
  
  if ((options & 0x1c) == 0) {
    if (arg_count == 0) {
      LVar3 = lyxp_set_cast(set,LYXP_SET_STRING);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      sVar6 = strlen((set->val).str);
      set_fill_number(set,(longdouble)*(float *)(&DAT_002593d8 + (ulong)((long)sVar6 < 0) * 4) +
                          (longdouble)(long)sVar6);
    }
    else {
      LVar3 = lyxp_set_cast(*args,LYXP_SET_STRING);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      sVar6 = strlen(((*args)->val).str);
      set_fill_number(set,(longdouble)*(float *)(&DAT_002593d8 + (ulong)((long)sVar6 < 0) * 4) +
                          (longdouble)(long)sVar6);
    }
  }
  else {
    if (((arg_count != 0) && ((*args)->type == LYXP_SET_SCNODE_SET)) &&
       (plVar4 = warn_get_scnode_in_ctx(*args), plVar4 != (lysc_node *)0x0)) {
      if ((plVar4->nodetype & 0xc) == 0) {
        plVar1 = set->ctx;
        pcVar5 = lys_nodetype2str(plVar4->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_string_length",pcVar5,plVar4->name);
      }
      else {
        lVar2 = warn_is_string_type((lysc_type *)plVar4[1].parent);
        if (lVar2 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_string_length",
                 plVar4->name);
        }
      }
    }
    if (((arg_count == 0) && (set->type == LYXP_SET_SCNODE_SET)) &&
       (plVar4 = warn_get_scnode_in_ctx(set), plVar4 != (lysc_node *)0x0)) {
      if ((plVar4->nodetype & 0xc) == 0) {
        plVar1 = set->ctx;
        pcVar5 = lys_nodetype2str(plVar4->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #0 of %s is a %s node \"%s\".",
               "xpath_string_length",pcVar5,plVar4->name);
      }
      else {
        lVar2 = warn_is_string_type((lysc_type *)plVar4[1].parent);
        if (lVar2 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #0 of %s is node \"%s\", not of string-type.","xpath_string_length",
                 plVar4->name);
        }
      }
    }
    set_scnode_clear_ctx(set,1);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_string_length(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        rc = lyxp_set_cast(set, LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(set->val.str));
    }

    return LY_SUCCESS;
}